

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O2

void __thiscall
hayai::ConsoleOutputter::EndTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,TestResult *result)

{
  uint64_t uVar1;
  size_t sVar2;
  long lVar3;
  double dVar4;
  ConsoleOutputter *pCVar5;
  ostream *poVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  TextColor local_70 [2];
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  ConsoleOutputter *local_40;
  TextColor local_38;
  TextColor local_34;
  
  local_70[0] = TextGreen;
  poVar6 = operator<<(this->_stream,local_70);
  poVar6 = std::operator<<(poVar6,"[     DONE ]");
  local_70[1] = 7;
  poVar6 = operator<<(poVar6,local_70 + 1);
  std::operator<<(poVar6," ");
  Outputter::WriteTestNameToStream(this->_stream,fixtureName,testName,parameters);
  local_70[0] = TextDefault;
  poVar6 = operator<<(this->_stream,local_70);
  poVar6 = std::operator<<(poVar6," (");
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 8) = 6;
  auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar11._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar11._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (((auVar11._8_8_ - 1.9342813113834067e+25) +
                      (auVar11._0_8_ - 4503599627370496.0)) / 1000000.0);
  poVar6 = std::operator<<(poVar6," ms)");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_70[0] = TextBlue;
  local_40 = this;
  poVar6 = operator<<(this->_stream,local_70);
  poVar6 = std::operator<<(poVar6,"[   RUNS   ] ");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,"       Average time: ");
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 8) = 3;
  dVar4 = TestResult::RunTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>(dVar4 / 1000.0);
  poVar6 = std::operator<<(poVar6," us ");
  poVar6 = std::operator<<(poVar6,"(");
  local_34 = TextBlue;
  poVar6 = operator<<(poVar6,&local_34);
  std::operator<<(poVar6,"~");
  poVar6 = std::ostream::_M_insert<double>(result->_timeStdDev / 1000.0);
  poVar6 = std::operator<<(poVar6," us");
  local_38 = TextDefault;
  poVar6 = operator<<(poVar6,&local_38);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._8_8_ =
       (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) - 1.9342813113834067e+25;
  local_68._0_8_ =
       (double)local_68._8_8_ +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0);
  local_68._8_8_ = (double)local_68._8_8_ + (double)local_68._8_8_;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar10._8_8_ = dVar4;
  auVar10._0_8_ = local_68._0_8_;
  auVar11 = divpd(auVar10,_DAT_00131110);
  local_68._8_8_ = auVar11._8_8_;
  local_68._0_8_ = auVar11._0_8_ - auVar11._8_8_;
  poVar6 = this->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Fastest time: ");
  auVar12._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMin);
  auVar12._8_4_ = (int)(result->_timeRunMin >> 0x20);
  auVar12._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (((auVar12._8_8_ - 1.9342813113834067e+25) +
                      (auVar12._0_8_ - 4503599627370496.0)) / 1000.0);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," (");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar13._8_8_ = dVar4;
  auVar13._0_8_ = local_58;
  auVar11 = divpd(auVar13,_DAT_00131110);
  local_70[0] = (uint)(auVar11._8_8_ < auVar11._0_8_) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar14._8_8_ = dVar4;
  auVar14._0_8_ = local_58;
  auVar11 = divpd(auVar14,_DAT_00131110);
  pcVar7 = "";
  pcVar8 = "";
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar8 = "+";
  }
  std::operator<<(poVar6,pcVar8);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," / ");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar15._8_8_ = dVar4;
  auVar15._0_8_ = local_58;
  auVar11 = divpd(auVar15,_DAT_00131110);
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  uVar9 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 100.0;
  local_68._12_4_ = uVar9;
  dVar4 = TestResult::RunTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / (dVar4 / 1000.0));
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._8_8_ =
       (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) - 1.9342813113834067e+25;
  local_68._0_8_ =
       (double)local_68._8_8_ +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0);
  local_68._8_8_ = (double)local_68._8_8_ + (double)local_68._8_8_;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar16._8_8_ = dVar4;
  auVar16._0_8_ = local_68._0_8_;
  auVar11 = divpd(auVar16,_DAT_00131110);
  local_68._8_8_ = auVar11._8_8_;
  local_68._0_8_ = auVar11._0_8_ - auVar11._8_8_;
  poVar6 = local_40->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Slowest time: ");
  auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMax);
  auVar17._8_4_ = (int)(result->_timeRunMax >> 0x20);
  auVar17._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (((auVar17._8_8_ - 1.9342813113834067e+25) +
                      (auVar17._0_8_ - 4503599627370496.0)) / 1000.0);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," (");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar18._8_8_ = dVar4;
  auVar18._0_8_ = local_58;
  auVar11 = divpd(auVar18,_DAT_00131110);
  local_70[0] = (uint)(auVar11._8_8_ < auVar11._0_8_) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar19._8_8_ = dVar4;
  auVar19._0_8_ = local_58;
  auVar11 = divpd(auVar19,_DAT_00131110);
  pcVar8 = "";
  pcVar7 = "";
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," / ");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0);
  dStack_50 = dStack_50 + dStack_50;
  dVar4 = TestResult::RunTimeAverage(result);
  auVar20._8_8_ = dVar4;
  auVar20._0_8_ = local_58;
  auVar11 = divpd(auVar20,_DAT_00131110);
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar8 = "+";
  }
  std::operator<<(poVar6,pcVar8);
  uVar9 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 100.0;
  local_68._12_4_ = uVar9;
  dVar4 = TestResult::RunTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / (dVar4 / 1000.0));
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  pCVar5 = local_40;
  poVar6 = local_40->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Median time: ");
  poVar6 = std::ostream::_M_insert<double>(result->_timeMedian / 1000.0);
  poVar6 = std::operator<<(poVar6," us (");
  local_70[0] = TextCyan;
  poVar6 = operator<<(poVar6,local_70);
  std::operator<<(poVar6,"1st quartile: ");
  poVar6 = std::ostream::_M_insert<double>(result->_timeQuartile1 / 1000.0);
  std::operator<<(poVar6," us | 3rd quartile: ");
  poVar6 = std::ostream::_M_insert<double>(result->_timeQuartile3 / 1000.0);
  poVar6 = std::operator<<(poVar6," us");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  lVar3 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar3 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x10) = 0x22;
  poVar6 = std::operator<<(poVar6,"");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Average performance: ");
  dVar4 = TestResult::RunsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>(dVar4);
  poVar6 = std::operator<<(poVar6," runs/s");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._0_8_ =
       1000000000.0 /
       (((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  local_68._0_8_ = (double)local_68._0_8_ - dVar4;
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Best performance: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)))
  ;
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"runs/s");
  poVar6 = std::operator<<(poVar6," (");
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  local_70[0] = (uint)(local_58 < dVar4) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  pcVar7 = "";
  pcVar8 = "";
  if (dVar4 < local_58) {
    pcVar8 = "+";
  }
  std::operator<<(poVar6,pcVar8);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"runs/s");
  poVar6 = std::operator<<(poVar6," / ");
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  local_68._0_8_ = (double)local_68._0_8_ * 100.0;
  dVar4 = TestResult::RunsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / dVar4);
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._0_8_ =
       1000000000.0 /
       (((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  pCVar5 = local_40;
  local_68._0_8_ = (double)local_68._0_8_ - dVar4;
  poVar6 = local_40->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Worst performance: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)))
  ;
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"runs/s");
  poVar6 = std::operator<<(poVar6," (");
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  local_70[0] = (uint)(local_58 < dVar4) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"runs/s");
  poVar6 = std::operator<<(poVar6," / ");
  local_58 = 1000000000.0 /
             (((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0));
  dVar4 = TestResult::RunsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  local_68._0_8_ = (double)local_68._0_8_ * 100.0;
  dVar4 = TestResult::RunsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / dVar4);
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Median performance: ");
  poVar6 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeMedian);
  poVar6 = std::operator<<(poVar6," runs/s (");
  local_70[0] = TextCyan;
  poVar6 = operator<<(poVar6,local_70);
  std::operator<<(poVar6,"1st quartile: ");
  poVar6 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile1);
  std::operator<<(poVar6," | 3rd quartile: ");
  poVar6 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile3);
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  poVar6 = std::operator<<(poVar6,"");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_70[0] = TextBlue;
  poVar6 = operator<<(pCVar5->_stream,local_70);
  poVar6 = std::operator<<(poVar6,"[ITERATIONS] ");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 8) = 3;
  std::operator<<(poVar6,"       Average time: ");
  dVar4 = TestResult::IterationTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>(dVar4 / 1000.0);
  poVar6 = std::operator<<(poVar6," us ");
  poVar6 = std::operator<<(poVar6,"(");
  local_34 = TextBlue;
  poVar6 = operator<<(poVar6,&local_34);
  std::operator<<(poVar6,"~");
  auVar21._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar21._8_4_ = (int)(result->_iterations >> 0x20);
  auVar21._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((result->_timeStdDev /
                      ((auVar21._8_8_ - 1.9342813113834067e+25) +
                      (auVar21._0_8_ - 4503599627370496.0))) / 1000.0);
  poVar6 = std::operator<<(poVar6," us");
  local_38 = TextDefault;
  poVar6 = operator<<(poVar6,&local_38);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._8_8_ =
       (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) - 1.9342813113834067e+25;
  local_68._0_8_ =
       ((double)local_68._8_8_ +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
       (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar22._8_8_ = dVar4;
  auVar22._0_8_ = local_68._0_8_;
  auVar11 = divpd(auVar22,_DAT_00131110);
  local_68._8_8_ = auVar11._8_8_;
  local_68._0_8_ = auVar11._0_8_ - auVar11._8_8_;
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Fastest time: ");
  uVar1 = result->_timeRunMin;
  auVar23._8_4_ = (int)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar24._8_4_ = (int)(sVar2 >> 0x20);
  auVar24._0_8_ = sVar2;
  auVar24._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar24._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," (");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar25._8_8_ = dVar4;
  auVar25._0_8_ = local_58;
  auVar11 = divpd(auVar25,_DAT_00131110);
  local_70[0] = (uint)(auVar11._8_8_ < auVar11._0_8_) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar26._8_8_ = dVar4;
  auVar26._0_8_ = local_58;
  auVar11 = divpd(auVar26,_DAT_00131110);
  pcVar7 = "";
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," / ");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar27._8_8_ = dVar4;
  auVar27._0_8_ = local_58;
  auVar11 = divpd(auVar27,_DAT_00131110);
  pcVar7 = "";
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  uVar9 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 100.0;
  local_68._12_4_ = uVar9;
  dVar4 = TestResult::IterationTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / (dVar4 / 1000.0));
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._8_8_ =
       (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) - 1.9342813113834067e+25;
  local_68._0_8_ =
       ((double)local_68._8_8_ +
       ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
       (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  pCVar5 = local_40;
  auVar28._8_8_ = dVar4;
  auVar28._0_8_ = local_68._0_8_;
  auVar11 = divpd(auVar28,_DAT_00131110);
  local_68._8_8_ = auVar11._8_8_;
  local_68._0_8_ = auVar11._0_8_ - auVar11._8_8_;
  poVar6 = local_40->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Slowest time: ");
  uVar1 = result->_timeRunMax;
  auVar29._8_4_ = (int)(uVar1 >> 0x20);
  auVar29._0_8_ = uVar1;
  auVar29._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar30._8_4_ = (int)(sVar2 >> 0x20);
  auVar30._0_8_ = sVar2;
  auVar30._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((((auVar29._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar30._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," (");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar31._8_8_ = dVar4;
  auVar31._0_8_ = local_58;
  auVar11 = divpd(auVar31,_DAT_00131110);
  local_70[0] = (uint)(auVar11._8_8_ < auVar11._0_8_) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar32._8_8_ = dVar4;
  auVar32._0_8_ = local_58;
  auVar11 = divpd(auVar32,_DAT_00131110);
  pcVar8 = "";
  pcVar7 = "";
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"us");
  poVar6 = std::operator<<(poVar6," / ");
  dStack_50 = (double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
              1.9342813113834067e+25;
  local_58 = (dStack_50 +
             ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0));
  dVar4 = TestResult::IterationTimeAverage(result);
  auVar33._8_8_ = dVar4;
  auVar33._0_8_ = local_58;
  auVar11 = divpd(auVar33,_DAT_00131110);
  if (auVar11._8_8_ < auVar11._0_8_) {
    pcVar8 = "+";
  }
  std::operator<<(poVar6,pcVar8);
  uVar9 = local_68._12_4_;
  local_68._8_4_ = local_68._8_4_;
  local_68._0_8_ = local_68._0_8_ * 100.0;
  local_68._12_4_ = uVar9;
  dVar4 = TestResult::IterationTimeAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / (dVar4 / 1000.0));
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Median time: ");
  auVar34._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar34._8_4_ = (int)(result->_iterations >> 0x20);
  auVar34._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((result->_timeMedian /
                      ((auVar34._8_8_ - 1.9342813113834067e+25) +
                      (auVar34._0_8_ - 4503599627370496.0))) / 1000.0);
  poVar6 = std::operator<<(poVar6," us (");
  local_70[0] = TextCyan;
  poVar6 = operator<<(poVar6,local_70);
  std::operator<<(poVar6,"1st quartile: ");
  auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar35._8_4_ = (int)(result->_iterations >> 0x20);
  auVar35._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile1 /
                      ((auVar35._8_8_ - 1.9342813113834067e+25) +
                      (auVar35._0_8_ - 4503599627370496.0))) / 1000.0);
  std::operator<<(poVar6," us | 3rd quartile: ");
  auVar36._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar36._8_4_ = (int)(result->_iterations >> 0x20);
  auVar36._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile3 /
                      ((auVar36._8_8_ - 1.9342813113834067e+25) +
                      (auVar36._0_8_ - 4503599627370496.0))) / 1000.0);
  poVar6 = std::operator<<(poVar6," us");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  lVar3 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar3 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x10) = 0x22;
  poVar6 = std::operator<<(poVar6,"");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Average performance: ");
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>(dVar4);
  poVar6 = std::operator<<(poVar6," iterations/s");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._0_8_ =
       1000000000.0 /
       ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) - 1.9342813113834067e+25)
        + ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
       (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  local_68._0_8_ = (double)local_68._0_8_ - dVar4;
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Best performance: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0))
                      / (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)
                        )));
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"iterations/s");
  poVar6 = std::operator<<(poVar6," (");
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  local_70[0] = (uint)(local_58 < dVar4) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"iterations/s");
  poVar6 = std::operator<<(poVar6," / ");
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMin >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMin) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  local_68._0_8_ = (double)local_68._0_8_ * 100.0;
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / dVar4);
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  local_68._0_8_ =
       1000000000.0 /
       ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) - 1.9342813113834067e+25)
        + ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
       (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  pCVar5 = local_40;
  local_68._0_8_ = (double)local_68._0_8_ - dVar4;
  poVar6 = local_40->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Worst performance: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0))
                      / (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)
                        )));
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"iterations/s");
  poVar6 = std::operator<<(poVar6," (");
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  local_70[0] = (uint)(local_58 < dVar4) * 2 + TextGreen;
  poVar6 = operator<<(poVar6,local_70);
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"iterations/s");
  poVar6 = std::operator<<(poVar6," / ");
  local_58 = 1000000000.0 /
             ((((double)CONCAT44(0x45300000,(int)(result->_timeRunMax >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)result->_timeRunMax) - 4503599627370496.0)) /
             (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)));
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  pcVar7 = "";
  if (dVar4 < local_58) {
    pcVar7 = "+";
  }
  std::operator<<(poVar6,pcVar7);
  local_68._0_8_ = (double)local_68._0_8_ * 100.0;
  dVar4 = TestResult::IterationsPerSecondAverage(result);
  poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_ / dVar4);
  poVar6 = std::operator<<(poVar6," %");
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = pCVar5->_stream;
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 0x22;
  std::operator<<(poVar6,"Median performance: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeMedian /
                      (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)))
                     );
  poVar6 = std::operator<<(poVar6," iterations/s (");
  local_70[0] = TextCyan;
  poVar6 = operator<<(poVar6,local_70);
  std::operator<<(poVar6,"1st quartile: ");
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile1 /
                      (((double)CONCAT44(0x45300000,(int)(result->_iterations >> 0x20)) -
                       1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)result->_iterations) - 4503599627370496.0)))
                     );
  std::operator<<(poVar6," | 3rd quartile: ");
  auVar37._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar37._8_4_ = (int)(result->_iterations >> 0x20);
  auVar37._12_4_ = 0x45300000;
  poVar6 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile3 /
                      ((auVar37._8_8_ - 1.9342813113834067e+25) +
                      (auVar37._0_8_ - 4503599627370496.0))));
  local_70[1] = 0;
  poVar6 = operator<<(poVar6,local_70 + 1);
  poVar6 = std::operator<<(poVar6,")");
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

virtual void EndTest(const std::string& fixtureName,
                             const std::string& testName,
                             const TestParametersDescriptor& parameters,
                             const TestResult& result)
        {
#define PAD(x) _stream << std::setw(34) << x << std::endl;
#define PAD_DEVIATION(description,                                      \
                      deviated,                                         \
                      average,                                          \
                      unit)                                             \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated < average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }
#define PAD_DEVIATION_INVERSE(description,                              \
                              deviated,                                 \
                              average,                                  \
                              unit)                                     \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated > average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }

            _stream << Console::TextGreen << "[     DONE ]"
                    << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault << " ("
                    << std::setprecision(6)
                    << (result.TimeTotal() / 1000000.0) << " ms)"
                    << std::endl;

            _stream << Console::TextBlue << "[   RUNS   ] "
                    << Console::TextDefault
                    << "       Average time: "
                    << std::setprecision(3)
                    << result.RunTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.RunTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.RunTimeMinimum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.RunTimeMaximum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.RunTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunTimeQuartile1() / 1000.0 << " us | 3rd quartile: " <<
                result.RunTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.RunsPerSecondAverage() << " runs/s");
            PAD_DEVIATION("Best performance: ",
                          result.RunsPerSecondMaximum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD_DEVIATION("Worst performance: ",
                          result.RunsPerSecondMinimum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD("Median performance: " <<
                result.RunsPerSecondMedian() << " runs/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunsPerSecondQuartile1() << " | 3rd quartile: " <<
                result.RunsPerSecondQuartile3() <<
                Console::TextDefault << ")");

            PAD("");
            _stream << Console::TextBlue << "[ITERATIONS] "
                    << Console::TextDefault
                    << std::setprecision(3)
                    << "       Average time: "
                    << result.IterationTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.IterationTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.IterationTimeMinimum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.IterationTimeMaximum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.IterationTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationTimeQuartile1() / 1000.0 <<
                " us | 3rd quartile: " <<
                result.IterationTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.IterationsPerSecondAverage() <<
                " iterations/s");
            PAD_DEVIATION("Best performance: ",
                          (result.IterationsPerSecondMaximum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD_DEVIATION("Worst performance: ",
                          (result.IterationsPerSecondMinimum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD("Median performance: " <<
                result.IterationsPerSecondMedian() << " iterations/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationsPerSecondQuartile1() <<
                " | 3rd quartile: " <<
                result.IterationsPerSecondQuartile3() <<
                Console::TextDefault << ")");

#undef PAD_DEVIATION_INVERSE
#undef PAD_DEVIATION
#undef PAD
        }